

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

void leveldb::PutVarint64(string *dst,uint64_t v)

{
  uint64_t in_RSI;
  char *in_RDI;
  char *ptr;
  char buf [10];
  char local_1a [18];
  char *local_8;
  
  local_8 = in_RDI;
  EncodeVarint64(local_1a,in_RSI);
  std::__cxx11::string::append(local_8,(ulong)local_1a);
  return;
}

Assistant:

void PutVarint64(std::string* dst, uint64_t v) {
  char buf[10];
  char* ptr = EncodeVarint64(buf, v);
  dst->append(buf, ptr - buf);
}